

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_ModuleCloner.h
# Opt level: O2

int __thiscall
soul::ModuleCloner::clone
          (ModuleCloner *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  undefined8 uVar1;
  Connection *pCVar2;
  Module *local_38;
  Module *local_30;
  FunctionMappings *local_28;
  
  pCVar2 = Module::allocate<soul::heart::Connection,soul::CodeLocation_const&>
                     (this->newModule,(CodeLocation *)(__fn + 8));
  pCVar2->interpolationType = *(InterpolationType *)(__fn + 0xa8);
  local_28 = *(FunctionMappings **)(__fn + 0x18);
  getRemappedProcessorInstance
            ((ModuleCloner *)&stack0xffffffffffffffc8,
             (pool_ptr<soul::heart::ProcessorInstance> *)this);
  (pCVar2->source).processor.object = (ProcessorInstance *)local_38;
  std::__cxx11::string::_M_assign((string *)&(pCVar2->source).endpointName);
  uVar1 = *(undefined8 *)(__fn + 0x48);
  (pCVar2->source).endpointIndex.super__Optional_base<unsigned_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long>._M_payload =
       *(_Storage<unsigned_long,_true> *)(__fn + 0x40);
  *(undefined8 *)
   &(pCVar2->source).endpointIndex.super__Optional_base<unsigned_long,_true,_true>._M_payload.
    super__Optional_payload_base<unsigned_long>._M_engaged = uVar1;
  local_30 = *(Module **)(__fn + 0x60);
  getRemappedProcessorInstance
            ((ModuleCloner *)&stack0xffffffffffffffc8,
             (pool_ptr<soul::heart::ProcessorInstance> *)this);
  (pCVar2->dest).processor.object = (ProcessorInstance *)local_38;
  std::__cxx11::string::_M_assign((string *)&(pCVar2->dest).endpointName);
  uVar1 = *(undefined8 *)(__fn + 0x90);
  (pCVar2->dest).endpointIndex.super__Optional_base<unsigned_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long>._M_payload =
       *(_Storage<unsigned_long,_true> *)(__fn + 0x88);
  *(undefined8 *)
   &(pCVar2->dest).endpointIndex.super__Optional_base<unsigned_long,_true,_true>._M_payload.
    super__Optional_payload_base<unsigned_long>._M_engaged = uVar1;
  uVar1 = *(undefined8 *)(__fn + 0xb8);
  (pCVar2->delayLength).super__Optional_base<long,_true,_true>._M_payload.
  super__Optional_payload_base<long>._M_payload = *(_Storage<long,_true> *)(__fn + 0xb0);
  *(undefined8 *)
   &(pCVar2->delayLength).super__Optional_base<long,_true,_true>._M_payload.
    super__Optional_payload_base<long>._M_engaged = uVar1;
  return (int)pCVar2;
}

Assistant:

heart::Connection& clone (const heart::Connection& old)
    {
        auto& c = newModule.allocate<heart::Connection> (old.location);
        c.interpolationType     = old.interpolationType;
        c.source.processor      = getRemappedProcessorInstance (old.source.processor);
        c.source.endpointName   = old.source.endpointName;
        c.source.endpointIndex  = old.source.endpointIndex;
        c.dest.processor        = getRemappedProcessorInstance (old.dest.processor);
        c.dest.endpointName     = old.dest.endpointName;
        c.dest.endpointIndex    = old.dest.endpointIndex;
        c.delayLength           = old.delayLength;
        return c;
    }